

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,char *params_2
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + fmt_str->_M_string_length);
  pcVar1 = (params->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + params->_M_string_length);
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,*(long *)params_2,*(long *)(params_2 + 8) + *(long *)params_2);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_90,&local_50,params_1,(char *)local_70,
             in_stack_ffffffffffffff68);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}